

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool BeginChildEx(char *name,ImGuiID id,ImVec2 *size_arg,bool border,ImGuiWindowFlags extra_flags)

{
  float fVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  undefined1 auVar4 [16];
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImGuiContext *g;
  ImVec2 IVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  char title [256];
  char local_138 [264];
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  uVar2 = pIVar3->Flags;
  IVar8 = ImGui::GetContentRegionAvail();
  iVar9 = (int)(*size_arg).x;
  iVar10 = (int)(*size_arg).y;
  fVar11 = (float)iVar9;
  fVar12 = (float)iVar10;
  if ((iVar9 < 1) && (fVar11 = IVar8.x + fVar11, fVar11 <= 4.0)) {
    fVar11 = 4.0;
  }
  if ((fVar12 <= 0.0) && (fVar12 = IVar8.y + fVar12, fVar12 <= 4.0)) {
    fVar12 = 4.0;
  }
  fVar1 = (pIVar5->Style).ChildBorderSize;
  if (!border) {
    (pIVar5->Style).ChildBorderSize = 0.0;
  }
  IVar8.y = fVar12;
  IVar8.x = fVar11;
  auVar4._4_4_ = -(uint)(iVar9 == 0);
  auVar4._0_4_ = -(uint)(iVar9 == 0);
  auVar4._8_4_ = -(uint)(iVar10 == 0);
  auVar4._12_4_ = -(uint)(iVar10 == 0);
  iVar9 = movmskpd(extra_flags,auVar4);
  if (name == (char *)0x0) {
    ImFormatString(local_138,0x100,"%s/%08X",pIVar3->Name,(ulong)id);
  }
  else {
    ImFormatString(local_138,0x100,"%s/%s",pIVar3->Name,name);
  }
  pIVar6 = GImGui;
  (GImGui->NextWindowData).SizeVal = IVar8;
  (pIVar6->NextWindowData).SizeCond = 1;
  bVar7 = ImGui::Begin(local_138,(bool *)0x0,uVar2 & 4 | extra_flags | 0x1000103);
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  pIVar3->ChildId = id;
  pIVar3->AutoFitChildAxises = iVar9;
  (pIVar5->Style).ChildBorderSize = fVar1;
  if ((((uint)extra_flags >> 0x17 & 1) == 0) &&
     ((((pIVar3->DC).NavLayerActiveMask != 0 || ((pIVar3->DC).NavHasScroll == true)) &&
      (pIVar5->NavActivateId == id)))) {
    ImGui::FocusWindow(pIVar3);
    ImGui::NavInitWindow(pIVar3,false);
    ImGui::SetActiveID(id + 1,pIVar3);
    pIVar5->ActiveIdSource = ImGuiInputSource_Nav;
  }
  return bVar7;
}

Assistant:

static bool BeginChildEx(const char* name, ImGuiID id, const ImVec2& size_arg, bool border, ImGuiWindowFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = ImGui::GetCurrentWindow();
    ImGuiWindowFlags flags = ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoResize|ImGuiWindowFlags_NoSavedSettings|ImGuiWindowFlags_ChildWindow;
    flags |= (parent_window->Flags & ImGuiWindowFlags_NoMove);  // Inherit the NoMove flag

    const ImVec2 content_avail = ImGui::GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    const int auto_fit_axises = ((size.x == 0.0f) ? (1 << ImGuiAxis_X) : 0x00) | ((size.y == 0.0f) ? (1 << ImGuiAxis_Y) : 0x00);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);

    const float backup_border_size = g.Style.ChildBorderSize;
    if (!border)
        g.Style.ChildBorderSize = 0.0f;
    flags |= extra_flags;

    char title[256];
    if (name)
        ImFormatString(title, IM_ARRAYSIZE(title), "%s/%s", parent_window->Name, name);
    else
        ImFormatString(title, IM_ARRAYSIZE(title), "%s/%08X", parent_window->Name, id);

    ImGui::SetNextWindowSize(size);
    bool ret = ImGui::Begin(title, NULL, flags);
    ImGuiWindow* child_window = ImGui::GetCurrentWindow();
    child_window->ChildId = id;
    child_window->AutoFitChildAxises = auto_fit_axises;
    g.Style.ChildBorderSize = backup_border_size;

    // Process navigation-in immediately so NavInit can run on first frame
    if (!(flags & ImGuiWindowFlags_NavFlattened) && (child_window->DC.NavLayerActiveMask != 0 || child_window->DC.NavHasScroll) && g.NavActivateId == id)
    {
        ImGui::FocusWindow(child_window);
        ImGui::NavInitWindow(child_window, false);
        ImGui::SetActiveID(id+1, child_window); // Steal ActiveId with a dummy id so that key-press won't activate child item
        g.ActiveIdSource = ImGuiInputSource_Nav;
    }

    return ret;
}